

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseException.h
# Opt level: O2

void AutoArgParse::printUnParsed
               (ostringstream *os,
               deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *flagInsertionOrder,FlagMap *flags)

{
  _Elt_pointer pbVar1;
  FlagBase *pFVar2;
  bool bVar3;
  char cVar4;
  mapped_type *pmVar5;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *flagInsertionOrder_00;
  char *pcVar6;
  _Elt_pointer pbVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *flag;
  _Elt_pointer __k;
  _Map_pointer local_38;
  
  __k = (flagInsertionOrder->
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Deque_impl_data._M_start._M_cur;
  pbVar7 = (flagInsertionOrder->
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_last;
  local_38 = (flagInsertionOrder->
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start._M_node;
  pbVar1 = (flagInsertionOrder->
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  bVar3 = true;
  while (__k != pbVar1) {
    pmVar5 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)flags,__k);
    cVar4 = (**(code **)((long)(((pmVar5->_M_t).
                                 super___uniq_ptr_impl<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_AutoArgParse::FlagBase_*,_std::default_delete<AutoArgParse::FlagBase>_>
                                 .super__Head_base<0UL,_AutoArgParse::FlagBase_*,_false>.
                                _M_head_impl)->super_ParseToken)._vptr_ParseToken + 0x28))();
    pFVar2 = (pmVar5->_M_t).
             super___uniq_ptr_impl<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>
             ._M_t.
             super__Tuple_impl<0UL,_AutoArgParse::FlagBase_*,_std::default_delete<AutoArgParse::FlagBase>_>
             .super__Head_base<0UL,_AutoArgParse::FlagBase_*,_false>._M_head_impl;
    if (cVar4 == '\0') {
      if (((pFVar2->super_ParseToken)._parsed == false) &&
         ((pFVar2->super_ParseToken)._available == true)) {
        pcVar6 = ", ";
        if (bVar3) {
          pcVar6 = " ";
        }
        std::operator<<((ostream *)os,pcVar6);
        if ((((pmVar5->_M_t).
              super___uniq_ptr_impl<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>
              ._M_t.
              super__Tuple_impl<0UL,_AutoArgParse::FlagBase_*,_std::default_delete<AutoArgParse::FlagBase>_>
              .super__Head_base<0UL,_AutoArgParse::FlagBase_*,_false>._M_head_impl)->
            super_ParseToken).policy == OPTIONAL) {
          std::operator<<((ostream *)os,"[");
        }
        std::operator<<((ostream *)os,(string *)__k);
        if ((((pmVar5->_M_t).
              super___uniq_ptr_impl<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>
              ._M_t.
              super__Tuple_impl<0UL,_AutoArgParse::FlagBase_*,_std::default_delete<AutoArgParse::FlagBase>_>
              .super__Head_base<0UL,_AutoArgParse::FlagBase_*,_false>._M_head_impl)->
            super_ParseToken).policy == OPTIONAL) {
          std::operator<<((ostream *)os,"]");
        }
        bVar3 = false;
      }
    }
    else {
      flagInsertionOrder_00 =
           (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(**(code **)((long)(pFVar2->super_ParseToken)._vptr_ParseToken + 0x30))();
      printUnParsed(os,flagInsertionOrder_00,flags);
    }
    __k = __k + 1;
    if (__k == pbVar7) {
      __k = local_38[1];
      local_38 = local_38 + 1;
      pbVar7 = __k + 0x10;
    }
  }
  return;
}

Assistant:

void printUnParsed(std::ostringstream& os,
                   const std::deque<std::string>& flagInsertionOrder,
                   const FlagMap& flags) {
    bool first = true;
    for (auto& flag : flagInsertionOrder) {
        auto& flagObj = flags.at(flag);
        if (flagObj->isExclusiveGroup()) {
            printUnParsed(os, flagObj->getFlagInsertionOrder(), flags);
            continue;
        }
        if (!flagObj->parsed() && flagObj->available()) {
            if (first) {
                os << " ";
                first = false;
            } else {
                os << ", ";
            }
            if (flagObj->policy == Policy::OPTIONAL) {
                os << "[";
            }
            os << flag;
            if (flagObj->policy == Policy::OPTIONAL) {
                os << "]";
            }
        }
    }
}